

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O2

QTextHtmlParserNode * __thiscall QTextHtmlParser::newNode(QTextHtmlParser *this,int parent)

{
  long lVar1;
  long lVar2;
  QTextHtmlParserNode **ppQVar3;
  bool bVar4;
  iterator iVar5;
  QTextHtmlParserNode *pQVar6;
  QTextHtmlParserNode *pQVar7;
  int iVar8;
  
  iVar5 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
  lVar1 = (this->nodes).d.size;
  if ((lVar1 != 1) && (pQVar6 = iVar5.i[-1], (pQVar6->tag).d.size == 0)) {
    lVar2 = (pQVar6->text).d.size;
    if (lVar2 == 0) {
LAB_00494d90:
      QString::clear(&pQVar6->tag);
      QString::clear(&pQVar6->text);
      pQVar6->id = Html_unknown;
      goto LAB_00494d11;
    }
    if ((lVar2 == 1) && (bVar4 = QChar::isSpace((uint)(ushort)*(pQVar6->text).d.ptr), bVar4)) {
      iVar8 = (int)lVar1 + -2;
      ppQVar3 = (this->nodes).d.ptr;
      while (iVar8 != 0) {
        pQVar7 = ppQVar3[iVar8];
        iVar8 = pQVar7->parent;
        if ((iVar8 == pQVar6->parent) || ((*(ushort *)&pQVar7->field_0x90 & 0xe00) != 0x200))
        goto LAB_00494d7a;
      }
      pQVar7 = *ppQVar3;
LAB_00494d7a:
      if ((*(ushort *)&pQVar7->field_0x90 & 0xe00) != 0x200) goto LAB_00494d90;
    }
  }
  pQVar6 = (QTextHtmlParserNode *)operator_new(0x1e0);
  QTextHtmlParserNode::QTextHtmlParserNode(pQVar6);
  QList<QTextHtmlParserNode_*>::append(&this->nodes,pQVar6);
  iVar5 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
  pQVar6 = iVar5.i[-1];
LAB_00494d11:
  pQVar6->parent = parent;
  return pQVar6;
}

Assistant:

QTextHtmlParserNode *QTextHtmlParser::newNode(int parent)
{
    QTextHtmlParserNode *lastNode = nodes.last();
    QTextHtmlParserNode *newNode = nullptr;

    bool reuseLastNode = true;

    if (nodes.size() == 1) {
        reuseLastNode = false;
    } else if (lastNode->tag.isEmpty()) {

        if (lastNode->text.isEmpty()) {
            reuseLastNode = true;
        } else { // last node is a text node (empty tag) with some text

            if (lastNode->text.size() == 1 && lastNode->text.at(0).isSpace()) {

                int lastSibling = count() - 2;
                while (lastSibling
                       && at(lastSibling).parent != lastNode->parent
                       && at(lastSibling).displayMode == QTextHtmlElement::DisplayInline) {
                    lastSibling = at(lastSibling).parent;
                }

                if (at(lastSibling).displayMode == QTextHtmlElement::DisplayInline) {
                    reuseLastNode = false;
                } else {
                    reuseLastNode = true;
                }
            } else {
                // text node with real (non-whitespace) text -> nothing to re-use
                reuseLastNode = false;
            }

        }

    } else {
        // last node had a proper tag -> nothing to re-use
        reuseLastNode = false;
    }

    if (reuseLastNode) {
        newNode = lastNode;
        newNode->tag.clear();
        newNode->text.clear();
        newNode->id = Html_unknown;
    } else {
        nodes.append(new QTextHtmlParserNode);
        newNode = nodes.last();
    }

    newNode->parent = parent;
    return newNode;
}